

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O1

void __thiscall
CGL::SceneObjects::BVHAccel::BVHAccel
          (BVHAccel *this,
          vector<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>
          *_primitives,size_t max_leaf_size)

{
  pointer ppPVar1;
  BVHNode *pBVar2;
  undefined1 local_28 [16];
  pointer local_18;
  
  (this->super_Aggregate).primitives.
  super__Vector_base<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Aggregate).primitives.
  super__Vector_base<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Aggregate).primitives.
  super__Vector_base<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Aggregate).super_Primitive._vptr_Primitive = (_func_int **)&PTR_get_bbox_00119b38;
  (this->primitives).
  super__Vector_base<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->primitives).
  super__Vector_base<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->primitives).
  super__Vector_base<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>::
  vector((vector<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_> *)
         local_28,_primitives);
  (this->primitives).
  super__Vector_base<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_18;
  ppPVar1 = (this->primitives).
            super__Vector_base<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  (this->primitives).
  super__Vector_base<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_28._0_8_;
  (this->primitives).
  super__Vector_base<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_28._8_8_;
  local_28 = ZEXT816(0) << 0x20;
  local_18 = (pointer)0x0;
  if (ppPVar1 != (pointer)0x0) {
    operator_delete(ppPVar1);
  }
  if ((pointer)local_28._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_28._0_8_);
  }
  pBVar2 = construct_bvh(this,(iterator)
                              (this->primitives).
                              super__Vector_base<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                         (iterator)
                         (this->primitives).
                         super__Vector_base<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,max_leaf_size);
  this->root = pBVar2;
  return;
}

Assistant:

BVHAccel::BVHAccel(const std::vector<Primitive *> &_primitives,
                   size_t max_leaf_size) {

  primitives = std::vector<Primitive *>(_primitives);
  root = construct_bvh(primitives.begin(), primitives.end(), max_leaf_size);
}